

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Arguments::parse(Arguments *this,int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  code *pcVar5;
  ulong uVar6;
  
  if (1 < argc) {
    uVar6 = 1;
    do {
      pcVar1 = argv[uVar6];
      pcVar3 = StringView::strchr(pcVar1,0);
      pcVar4 = StringView::strchr("-c",0);
      if (pcVar3 + -(long)pcVar1 == pcVar4 + -0x13a6b1) {
        iVar2 = StringView::strncmp(pcVar1,"-c",(size_t)(pcVar3 + -(long)pcVar1));
        if (iVar2 != 0) goto LAB_0010c574;
        pcVar5 = CodegenC::codegen;
LAB_0010c5d4:
        this->codegen = pcVar5;
      }
      else {
LAB_0010c574:
        pcVar1 = argv[uVar6];
        pcVar3 = StringView::strchr(pcVar1,0);
        pcVar4 = StringView::strchr("-js",0);
        if (pcVar3 + -(long)pcVar1 == pcVar4 + -0x13a6b4) {
          iVar2 = StringView::strncmp(pcVar1,"-js",(size_t)(pcVar3 + -(long)pcVar1));
          if (iVar2 == 0) {
            pcVar5 = CodegenJS::codegen;
            goto LAB_0010c5d4;
          }
        }
        this->source_path = argv[uVar6];
      }
      uVar6 = uVar6 + 1;
    } while ((uint)argc != uVar6);
  }
  return;
}

Assistant:

void parse(int argc, char** argv) {
		for (int i = 1; i < argc; ++i) {
			if (StringView(argv[i]) == "-c") codegen = CodegenC::codegen;
			else if (StringView(argv[i]) == "-js") codegen = CodegenJS::codegen;
			else source_path = argv[i];
		}
	}